

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  ImDrawList **ppIVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  ImDrawCmd *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImDrawList **ppIVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  
  ppIVar9 = (this->CmdLists).Data;
  ppIVar1 = ppIVar9 + (this->CmdLists).Size;
  for (; ppIVar9 != ppIVar1; ppIVar9 = ppIVar9 + 1) {
    pIVar5 = ((*ppIVar9)->CmdBuffer).Data;
    iVar4 = ((*ppIVar9)->CmdBuffer).Size;
    for (lVar10 = 0; (long)iVar4 * 0x38 - lVar10 != 0; lVar10 = lVar10 + 0x38) {
      pfVar2 = (float *)((long)&(pIVar5->ClipRect).x + lVar10);
      fVar6 = pfVar2[1];
      fVar7 = pfVar2[2];
      fVar8 = pfVar2[3];
      fVar11 = (*fb_scale).x;
      fVar12 = (*fb_scale).y;
      pfVar3 = (float *)((long)&(pIVar5->ClipRect).x + lVar10);
      *pfVar3 = *pfVar2 * fVar11;
      pfVar3[1] = fVar6 * fVar12;
      pfVar3[2] = fVar7 * fVar11;
      pfVar3[3] = fVar8 * fVar12;
    }
  }
  return;
}

Assistant:

inline T*           begin()                             { return Data; }